

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QPalette>_>::rehash
          (Data<QHashPrivate::Node<QByteArray,_QPalette>_> *this,size_t sizeHint)

{
  Entry *key;
  ulong uVar1;
  Span *pSVar2;
  Data *pDVar3;
  char *pcVar4;
  qsizetype qVar5;
  QPalettePrivate *pQVar6;
  Node<QByteArray,_QPalette> *pNVar7;
  ulong uVar8;
  Span *pSVar9;
  size_t index;
  long lVar10;
  size_t sVar11;
  long lVar12;
  R RVar13;
  Bucket BVar14;
  QByteArrayView QVar15;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar11 = 0x80;
  if ((0x40 < sizeHint) && (sVar11 = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar10 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    sVar11 = 1L << (0x41 - ((byte)lVar10 ^ 0x3f) & 0x3f);
  }
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  RVar13 = allocateSpans(sVar11);
  this->spans = (Span *)RVar13.spans;
  this->numBuckets = sVar11;
  if (uVar1 < 0x80) {
    if (pSVar2 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar8 = 0;
    pSVar9 = pSVar2;
    do {
      lVar10 = 0;
      do {
        if ((ulong)pSVar9->offsets[lVar10] != 0xff) {
          key = pSVar2[uVar8].entries + pSVar9->offsets[lVar10];
          QVar15.m_data = *(char **)((long)(key->storage).data + 8);
          QVar15.m_size = *(qsizetype *)((long)(key->storage).data + 0x10);
          sVar11 = qHash(QVar15,this->seed);
          BVar14 = findBucketWithHash<QByteArray>(this,(QByteArray *)key,sVar11);
          pNVar7 = Span<QHashPrivate::Node<QByteArray,_QPalette>_>::insert(BVar14.span,BVar14.index)
          ;
          pDVar3 = *(Data **)(key->storage).data;
          *(Data **)(key->storage).data = (Data *)0x0;
          (pNVar7->key).d.d = pDVar3;
          pcVar4 = *(char **)((long)(key->storage).data + 8);
          *(char **)((long)(key->storage).data + 8) = (char *)0x0;
          (pNVar7->key).d.ptr = pcVar4;
          qVar5 = *(qsizetype *)((long)(key->storage).data + 0x10);
          *(qsizetype *)((long)(key->storage).data + 0x10) = 0;
          (pNVar7->key).d.size = qVar5;
          pQVar6 = *(QPalettePrivate **)((long)(key->storage).data + 0x18);
          *(undefined8 *)((long)(key->storage).data + 0x18) = 0;
          (pNVar7->value).d = pQVar6;
          (pNVar7->value).currentGroup = *(ColorGroup *)((long)(key->storage).data + 0x20);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x80);
      Span<QHashPrivate::Node<QByteArray,_QPalette>_>::freeData(pSVar2 + uVar8);
      uVar8 = uVar8 + 1;
      pSVar9 = pSVar9 + 1;
    } while (uVar8 != uVar1 >> 7);
  }
  lVar10 = *(long *)&pSVar2[-1].allocated;
  if (lVar10 != 0) {
    lVar12 = lVar10 * 0x90;
    do {
      Span<QHashPrivate::Node<QByteArray,_QPalette>_>::freeData
                ((Span<QHashPrivate::Node<QByteArray,_QPalette>_> *)(pSVar2[-1].offsets + lVar12));
      lVar12 = lVar12 + -0x90;
    } while (lVar12 != 0);
  }
  operator_delete__(&pSVar2[-1].allocated,lVar10 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }